

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O2

void __thiscall avro::json::JsonGenerator::escape(JsonGenerator *this,char c,char *b,char *p)

{
  void *__buf;
  void *__buf_00;
  
  write(this,(int)b,p,(size_t)p);
  StreamWriter::write(&this->out_,0x5c,__buf,(size_t)p);
  StreamWriter::write(&this->out_,(uint)(byte)c,__buf_00,(size_t)p);
  return;
}

Assistant:

void escape(char c, const char* b, const char *p) {
        write(b, p);
        out_.write('\\');
        out_.write(c);
    }